

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526.hpp
# Opt level: O2

void __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::MOS6526
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,
          CIAAHandler *port_handler)

{
  MOS6526Storage::MOS6526Storage(&this->super_MOS6526Storage);
  (this->super_ReadDelegate)._vptr_ReadDelegate =
       (_func_int **)&PTR_serial_line_did_produce_bit_0057cde8;
  Serial::Line<true>::Line(&this->serial_input);
  this->port_handler_ = port_handler;
  (this->tod_).super_TODBase.write_alarm = false;
  (this->tod_).super_TODBase.is_50Hz = false;
  (this->tod_).increment_mask_ = 0xffffffff;
  (this->tod_).latch_ = 0;
  (this->tod_).value_ = 0;
  (this->tod_).alarm_ = 0xffffff;
  Serial::Line<true>::set_read_delegate
            (&this->serial_input,&this->super_ReadDelegate,(Time)0x100000000);
  return;
}

Assistant:

MOS6526(PortHandlerT &port_handler) noexcept : port_handler_(port_handler) {
			serial_input.set_read_delegate(this);
		}